

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doh.c
# Opt level: O0

void de_cleanup(dohentry *d)

{
  int local_14;
  int i;
  dohentry *d_local;
  
  for (local_14 = 0; local_14 < d->numcname; local_14 = local_14 + 1) {
    Curl_dyn_free(d->cname + local_14);
  }
  return;
}

Assistant:

UNITTEST void de_cleanup(struct dohentry *d)
{
  int i = 0;
  for(i = 0; i < d->numcname; i++) {
    Curl_dyn_free(&d->cname[i]);
  }
#ifdef USE_HTTPSRR
  for(i = 0; i < d->numhttps_rrs; i++)
    Curl_safefree(d->https_rrs[i].val);
#endif
}